

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O0

ngram_raw_t **
ngrams_raw_read_arpa(lineiter_t **li,logmath_t *lmath,uint32 *counts,int order,hash_table_t *wid)

{
  int iVar1;
  lineiter_t *plVar2;
  int local_44;
  int order_it;
  ngram_raw_t **raw_ngrams;
  hash_table_t *wid_local;
  int order_local;
  uint32 *counts_local;
  logmath_t *lmath_local;
  lineiter_t **li_local;
  
  li_local = (lineiter_t **)
             __ckd_calloc__((long)(order + -1),8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                            ,0xae);
  local_44 = 2;
  while ((local_44 <= order &&
         (iVar1 = ngrams_raw_read_section
                            ((ngram_raw_t **)(li_local + (local_44 + -2)),li,wid,lmath,
                             counts + (long)local_44 + -1,local_44,order), -1 < iVar1))) {
    local_44 = local_44 + 1;
  }
  if (*li == (lineiter_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
            ,0xb8,"ARPA file ends without end-mark\n");
    ngrams_raw_free((ngram_raw_t **)li_local,counts,order);
    li_local = (lineiter_t **)0x0;
  }
  else {
    plVar2 = lineiter_next(*li);
    *li = plVar2;
    iVar1 = strcmp((*li)->buf,"\\end\\");
    if (iVar1 != 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
              ,0xc0,"Finished reading ARPA file. Expecting end mark but found \'%s\'\n",(*li)->buf);
    }
  }
  return (ngram_raw_t **)li_local;
}

Assistant:

ngram_raw_t **
ngrams_raw_read_arpa(lineiter_t ** li, logmath_t * lmath, uint32 * counts,
                     int order, hash_table_t * wid)
{
    ngram_raw_t **raw_ngrams;
    int order_it;

    raw_ngrams =
        (ngram_raw_t **) ckd_calloc(order - 1, sizeof(*raw_ngrams));

    for (order_it = 2; order_it <= order; order_it++) {
        if (ngrams_raw_read_section(&raw_ngrams[order_it - 2], li, wid, lmath,
                              counts + order_it - 1, order_it, order) < 0)
        break;
    }

    /* Check if we found ARPA end-mark */
    if (*li == NULL) {
        E_ERROR("ARPA file ends without end-mark\n");
	ngrams_raw_free(raw_ngrams, counts, order);
        return NULL;
    } else {
        *li = lineiter_next(*li);
	if (strcmp((*li)->buf, "\\end\\") != 0) {
    	    E_WARN
        	("Finished reading ARPA file. Expecting end mark but found '%s'\n",
        	 (*li)->buf);
        }
    }

    return raw_ngrams;
}